

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

void __thiscall
charls::jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::encoder_strategy>
::encode_lines(jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::encoder_strategy>
               *this)

{
  pixel_type *ppVar1;
  process_line *ppVar2;
  int iVar3;
  quad<unsigned_char> *__tmp;
  pixel_type *ppVar4;
  uint32_t line;
  uint uVar5;
  size_t component;
  ulong uVar6;
  size_type sVar7;
  size_type __n;
  allocator_type local_69;
  long local_68;
  vector<int,_std::allocator<int>_> run_index;
  vector<charls::quad<unsigned_char>,_std::allocator<charls::quad<unsigned_char>_>_> line_buffer;
  
  uVar6 = (ulong)(this->width_ + 4);
  if ((this->super_encoder_strategy).parameters_.interleave_mode == Line) {
    iVar3 = (this->super_encoder_strategy).frame_info_.component_count;
  }
  else {
    iVar3 = 1;
  }
  __n = (size_type)iVar3;
  local_68 = __n * uVar6;
  std::vector<charls::quad<unsigned_char>,_std::allocator<charls::quad<unsigned_char>_>_>::vector
            (&line_buffer,local_68 * 2,(allocator_type *)&run_index);
  std::vector<int,_std::allocator<int>_>::vector(&run_index,__n,&local_69);
  for (uVar5 = 0; uVar5 < (this->super_encoder_strategy).frame_info_.height; uVar5 = uVar5 + 1) {
    ppVar1 = line_buffer.
             super__Vector_base<charls::quad<unsigned_char>,_std::allocator<charls::quad<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
    this->previous_line_ = ppVar1;
    ppVar4 = line_buffer.
             super__Vector_base<charls::quad<unsigned_char>,_std::allocator<charls::quad<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start + local_68 + 1;
    this->current_line_ = ppVar4;
    if ((uVar5 & 1) != 0) {
      this->previous_line_ = ppVar4;
      this->current_line_ = ppVar1;
      ppVar4 = ppVar1;
    }
    ppVar2 = (this->super_encoder_strategy).process_line_._M_t.
             super___uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_>
             ._M_t.
             super__Tuple_impl<0UL,_charls::process_line_*,_std::default_delete<charls::process_line>_>
             .super__Head_base<0UL,_charls::process_line_*,_false>._M_head_impl;
    (*ppVar2->_vptr_process_line[3])(ppVar2,ppVar4,(ulong)this->width_,uVar6);
    for (sVar7 = 0; __n != sVar7; sVar7 = sVar7 + 1) {
      this->run_index_ =
           run_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[sVar7];
      this->previous_line_[this->width_] = this->previous_line_[this->width_ - 1];
      this->current_line_[-1] = *this->previous_line_;
      do_line(this,(quad<unsigned_char> *)0x0);
      run_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar7] = this->run_index_;
      this->previous_line_ = this->previous_line_ + uVar6;
      this->current_line_ = this->current_line_ + uVar6;
    }
  }
  encoder_strategy::end_scan(&this->super_encoder_strategy);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&run_index.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<charls::quad<unsigned_char>,_std::allocator<charls::quad<unsigned_char>_>_>::
  ~_Vector_base(&line_buffer.
                 super__Vector_base<charls::quad<unsigned_char>,_std::allocator<charls::quad<unsigned_char>_>_>
               );
  return;
}

Assistant:

void encode_lines()
    {
        const uint32_t pixel_stride{width_ + 4U};
        const size_t component_count{
            parameters().interleave_mode == interleave_mode::line ? static_cast<size_t>(frame_info().component_count) : 1U};

        std::vector<pixel_type> line_buffer(component_count * pixel_stride * 2);
        std::vector<int32_t> run_index(component_count);

        for (uint32_t line{}; line < frame_info().height; ++line)
        {
            previous_line_ = &line_buffer[1];
            current_line_ = &line_buffer[1 + static_cast<size_t>(component_count) * pixel_stride];
            if ((line & 1) == 1)
            {
                std::swap(previous_line_, current_line_);
            }

            Strategy::on_line_begin(current_line_, width_, pixel_stride);

            for (size_t component{}; component < component_count; ++component)
            {
                run_index_ = run_index[component];

                // initialize edge pixels used for prediction
                previous_line_[width_] = previous_line_[width_ - 1];
                current_line_[-1] = previous_line_[0];
                do_line(static_cast<pixel_type*>(nullptr)); // dummy argument for overload resolution

                run_index[component] = run_index_;
                previous_line_ += pixel_stride;
                current_line_ += pixel_stride;
            }
        }

        Strategy::end_scan();
    }